

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SettingsHandlerWindow_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  int iVar1;
  undefined8 in_RCX;
  long in_RDX;
  ImVec2 IVar2;
  int i;
  float y;
  float x;
  ImGuiWindowSettings *settings;
  ImVec2 *in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ImVec2 local_3c;
  int local_34;
  float local_30;
  float local_2c;
  long local_28;
  undefined8 local_20;
  
  local_28 = in_RDX;
  local_20 = in_RCX;
  iVar1 = __isoc99_sscanf(in_RCX,"Pos=%f,%f",&local_2c,&local_30);
  if (iVar1 == 2) {
    ImVec2::ImVec2(&local_3c,local_2c,local_30);
    *(ImVec2 *)(local_28 + 0xc) = local_3c;
  }
  else {
    iVar1 = __isoc99_sscanf(local_20,"Size=%f,%f",&local_2c,&local_30);
    if (iVar1 == 2) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,local_2c,local_30);
      IVar2 = ImMax((ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    in_stack_ffffffffffffffb0);
      *(ImVec2 *)(local_28 + 0x14) = IVar2;
    }
    else {
      iVar1 = __isoc99_sscanf(local_20,"Collapsed=%d",&local_34);
      if (iVar1 == 1) {
        *(bool *)(local_28 + 0x1c) = local_34 != 0;
      }
    }
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    float x, y;
    int i;
    if (sscanf(line, "Pos=%f,%f", &x, &y) == 2)         settings->Pos = ImVec2(x, y);
    else if (sscanf(line, "Size=%f,%f", &x, &y) == 2)   settings->Size = ImMax(ImVec2(x, y), GImGui->Style.WindowMinSize);
    else if (sscanf(line, "Collapsed=%d", &i) == 1)     settings->Collapsed = (i != 0);
}